

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O1

bool __thiscall
llbuild::buildsystem::ExternalCommand::configureAttribute
          (ExternalCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  undefined4 uVar1;
  NodeKind NVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Child local_f8 [2];
  undefined2 local_e8;
  undefined6 uStack_e6;
  Child local_d8 [2];
  undefined2 local_c8;
  undefined6 uStack_c6;
  Twine local_b8;
  Child local_a0;
  NodeKind local_90;
  char cStack_8f;
  undefined6 uStack_8e;
  Child local_88;
  NodeKind local_78;
  char cStack_77;
  undefined6 uStack_76;
  Child local_70;
  NodeKind local_60;
  char cStack_5f;
  undefined6 uStack_5e;
  Child local_58;
  NodeKind local_48;
  char cStack_47;
  undefined6 uStack_46;
  StringRef local_40;
  StringRef local_30;
  
  local_40.Length = name.Length;
  local_40.Data = name.Data;
  local_30.Length = value.Length;
  local_30.Data = value.Data;
  if ((long)local_40.Length < 0x16) {
    if (local_40.Length != 0x12) {
      if (local_40.Length == 0x14) {
        uVar1 = *(undefined4 *)(local_40.Data + 0x10);
        auVar8[0] = -((char)uVar1 == 'p');
        auVar8[1] = -((char)((uint)uVar1 >> 8) == 'u');
        auVar8[2] = -((char)((uint)uVar1 >> 0x10) == 't');
        auVar8[3] = -((char)((uint)uVar1 >> 0x18) == 's');
        auVar8[4] = 0xff;
        auVar8[5] = 0xff;
        auVar8[6] = 0xff;
        auVar8[7] = 0xff;
        auVar8[8] = 0xff;
        auVar8[9] = 0xff;
        auVar8[10] = 0xff;
        auVar8[0xb] = 0xff;
        auVar8[0xc] = 0xff;
        auVar8[0xd] = 0xff;
        auVar8[0xe] = 0xff;
        auVar8[0xf] = 0xff;
        auVar4[0] = -(*local_40.Data == 'a');
        auVar4[1] = -(local_40.Data[1] == 'l');
        auVar4[2] = -(local_40.Data[2] == 'l');
        auVar4[3] = -(local_40.Data[3] == 'o');
        auVar4[4] = -(local_40.Data[4] == 'w');
        auVar4[5] = -(local_40.Data[5] == '-');
        auVar4[6] = -(local_40.Data[6] == 'm');
        auVar4[7] = -(local_40.Data[7] == 'i');
        auVar4[8] = -(local_40.Data[8] == 's');
        auVar4[9] = -(local_40.Data[9] == 's');
        auVar4[10] = -(local_40.Data[10] == 'i');
        auVar4[0xb] = -(local_40.Data[0xb] == 'n');
        auVar4[0xc] = -(local_40.Data[0xc] == 'g');
        auVar4[0xd] = -(local_40.Data[0xd] == '-');
        auVar4[0xe] = -(local_40.Data[0xe] == 'i');
        auVar4[0xf] = -(local_40.Data[0xf] == 'n');
        auVar4 = auVar4 & auVar8;
        if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
          if (((local_30.Length == 4) && (*(int *)local_30.Data == 0x65757274)) ||
             ((local_30.Length == 5 &&
              ((char)*(int *)((long)local_30.Data + 4) == 'e' && *(int *)local_30.Data == 0x736c6166
              )))) {
            if (local_30.Length == 4) {
              bVar3 = *(int *)local_30.Data == 0x65757274;
            }
            else {
              bVar3 = false;
            }
            this->allowMissingInputs = bVar3;
            return true;
          }
          goto LAB_001ac6a1;
        }
      }
      goto LAB_001ac4e1;
    }
    auVar6[0] = -(*local_40.Data == 'a');
    auVar6[1] = -(local_40.Data[1] == 'l');
    auVar6[2] = -(local_40.Data[2] == 'w');
    auVar6[3] = -(local_40.Data[3] == 'a');
    auVar6[4] = -(local_40.Data[4] == 'y');
    auVar6[5] = -(local_40.Data[5] == 's');
    auVar6[6] = -(local_40.Data[6] == '-');
    auVar6[7] = -(local_40.Data[7] == 'o');
    auVar6[8] = -(local_40.Data[8] == 'u');
    auVar6[9] = -(local_40.Data[9] == 't');
    auVar6[10] = -(local_40.Data[10] == '-');
    auVar6[0xb] = -(local_40.Data[0xb] == 'o');
    auVar6[0xc] = -(local_40.Data[0xc] == 'f');
    auVar6[0xd] = -(local_40.Data[0xd] == '-');
    auVar6[0xe] = -(local_40.Data[0xe] == 'd');
    auVar6[0xf] = -(local_40.Data[0xf] == 'a');
    auVar10[0] = -((char)*(undefined2 *)(local_40.Data + 0x10) == 't');
    auVar10[1] = -((char)((ushort)*(undefined2 *)(local_40.Data + 0x10) >> 8) == 'e');
    auVar10[2] = 0xff;
    auVar10[3] = 0xff;
    auVar10[4] = 0xff;
    auVar10[5] = 0xff;
    auVar10[6] = 0xff;
    auVar10[7] = 0xff;
    auVar10[8] = 0xff;
    auVar10[9] = 0xff;
    auVar10[10] = 0xff;
    auVar10[0xb] = 0xff;
    auVar10[0xc] = 0xff;
    auVar10[0xd] = 0xff;
    auVar10[0xe] = 0xff;
    auVar10[0xf] = 0xff;
    auVar10 = auVar10 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001ac4b3;
    if (((local_30.Length == 4) && (*(int *)local_30.Data == 0x65757274)) ||
       ((local_30.Length == 5 &&
        ((char)*(int *)((long)local_30.Data + 4) == 'e' && *(int *)local_30.Data == 0x736c6166)))) {
      if (local_30.Length == 4) {
        bVar3 = *(int *)local_30.Data == 0x65757274;
      }
      else {
        bVar3 = false;
      }
      this->alwaysOutOfDate = bVar3;
      return true;
    }
LAB_001ac6a1:
    llvm::Twine::Twine((Twine *)&local_58,"invalid value: \'",&local_30);
    llvm::Twine::Twine((Twine *)&local_70,"\' for attribute \'");
    if ((local_48 == NullKind) || (local_60 == NullKind)) {
      local_e8 = 0x100;
    }
    else if (local_48 == EmptyKind) {
      local_e8._1_1_ = cStack_5f;
      local_e8._0_1_ = local_60;
      uStack_e6 = uStack_5e;
      local_f8[0] = local_70;
    }
    else if (local_60 == EmptyKind) {
      local_e8._1_1_ = cStack_47;
      local_e8._0_1_ = local_48;
      uStack_e6 = uStack_46;
      local_f8[0] = local_58;
    }
    else {
      if (cStack_47 != '\x01') {
        local_48 = TwineKind;
        local_58.twine = (Twine *)&local_58;
      }
      if (cStack_5f != '\x01') {
        local_60 = TwineKind;
        local_70.twine = (Twine *)&local_70;
      }
      llvm::Twine::Twine((Twine *)local_f8,local_58,local_48,local_70,local_60);
    }
    llvm::Twine::Twine((Twine *)&local_88,&local_40);
    if (((NodeKind)local_e8 == NullKind) || (local_78 == NullKind)) {
      local_c8 = 0x100;
    }
    else if ((NodeKind)local_e8 == EmptyKind) {
      local_c8._1_1_ = cStack_77;
      local_c8._0_1_ = local_78;
      uStack_c6 = uStack_76;
      local_d8[0] = local_88;
    }
    else if (local_78 == EmptyKind) {
      local_c8._0_1_ = (NodeKind)local_e8;
      local_c8._1_1_ = local_e8._1_1_;
      uStack_c6 = uStack_e6;
      local_d8[0] = local_f8[0];
    }
    else {
      NVar2 = (NodeKind)local_e8;
      if (local_e8._1_1_ != EmptyKind) {
        local_f8[0].twine = (Twine *)local_f8;
        NVar2 = TwineKind;
      }
      if (cStack_77 != '\x01') {
        local_78 = TwineKind;
        local_88.twine = (Twine *)&local_88;
      }
      llvm::Twine::Twine((Twine *)local_d8,local_f8[0],NVar2,local_88,local_78);
    }
    llvm::Twine::Twine((Twine *)&local_a0,"\'");
    if (((NodeKind)local_c8 == NullKind) || (local_90 == NullKind)) goto LAB_001ac8e2;
    if ((NodeKind)local_c8 == EmptyKind) {
      local_b8.RHSKind = cStack_8f;
      local_b8.LHSKind = local_90;
      local_b8._18_6_ = uStack_8e;
      goto LAB_001ac951;
    }
    if (local_90 == EmptyKind) {
      local_b8.LHSKind = (NodeKind)local_c8;
      local_b8.RHSKind = local_c8._1_1_;
      local_b8._18_6_ = uStack_c6;
      goto LAB_001ac951;
    }
    NVar2 = (NodeKind)local_c8;
    if (local_c8._1_1_ != EmptyKind) {
      local_d8[0].twine = (Twine *)local_d8;
      NVar2 = TwineKind;
    }
    if (cStack_8f != '\x01') {
      local_90 = TwineKind;
      local_a0.twine = (Twine *)&local_a0;
    }
  }
  else {
    if (local_40.Length == 0x16) {
      auVar9[0] = -(local_40.Data[6] == 'm');
      auVar9[1] = -(local_40.Data[7] == 'o');
      auVar9[2] = -(local_40.Data[8] == 'd');
      auVar9[3] = -(local_40.Data[9] == 'i');
      auVar9[4] = -(local_40.Data[10] == 'f');
      auVar9[5] = -(local_40.Data[0xb] == 'i');
      auVar9[6] = -(local_40.Data[0xc] == 'e');
      auVar9[7] = -(local_40.Data[0xd] == 'd');
      auVar9[8] = -(local_40.Data[0xe] == '-');
      auVar9[9] = -(local_40.Data[0xf] == 'o');
      auVar9[10] = -(local_40.Data[0x10] == 'u');
      auVar9[0xb] = -(local_40.Data[0x11] == 't');
      auVar9[0xc] = -(local_40.Data[0x12] == 'p');
      auVar9[0xd] = -(local_40.Data[0x13] == 'u');
      auVar9[0xe] = -(local_40.Data[0x14] == 't');
      auVar9[0xf] = -(local_40.Data[0x15] == 's');
      auVar5[0] = -(*local_40.Data == 'a');
      auVar5[1] = -(local_40.Data[1] == 'l');
      auVar5[2] = -(local_40.Data[2] == 'l');
      auVar5[3] = -(local_40.Data[3] == 'o');
      auVar5[4] = -(local_40.Data[4] == 'w');
      auVar5[5] = -(local_40.Data[5] == '-');
      auVar5[6] = -(local_40.Data[6] == 'm');
      auVar5[7] = -(local_40.Data[7] == 'o');
      auVar5[8] = -(local_40.Data[8] == 'd');
      auVar5[9] = -(local_40.Data[9] == 'i');
      auVar5[10] = -(local_40.Data[10] == 'f');
      auVar5[0xb] = -(local_40.Data[0xb] == 'i');
      auVar5[0xc] = -(local_40.Data[0xc] == 'e');
      auVar5[0xd] = -(local_40.Data[0xd] == 'd');
      auVar5[0xe] = -(local_40.Data[0xe] == '-');
      auVar5[0xf] = -(local_40.Data[0xf] == 'o');
      auVar5 = auVar5 & auVar9;
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
        if (((local_30.Length == 4) && (*(int *)local_30.Data == 0x65757274)) ||
           ((local_30.Length == 5 &&
            ((char)*(int *)((long)local_30.Data + 4) == 'e' && *(int *)local_30.Data == 0x736c6166))
           )) {
          if (local_30.Length == 4) {
            bVar3 = *(int *)local_30.Data == 0x65757274;
          }
          else {
            bVar3 = false;
          }
          this->allowModifiedOutputs = bVar3;
          return true;
        }
        goto LAB_001ac6a1;
      }
    }
    else {
LAB_001ac4b3:
      if ((local_40.Length == 0x1d) &&
         (auVar11[0] = -(local_40.Data[0xd] == 'n'), auVar11[1] = -(local_40.Data[0xe] == 'e'),
         auVar11[2] = -(local_40.Data[0xf] == 'r'), auVar11[3] = -(local_40.Data[0x10] == 's'),
         auVar11[4] = -(local_40.Data[0x11] == 'h'), auVar11[5] = -(local_40.Data[0x12] == 'i'),
         auVar11[6] = -(local_40.Data[0x13] == 'p'), auVar11[7] = -(local_40.Data[0x14] == '-'),
         auVar11[8] = -(local_40.Data[0x15] == 'a'), auVar11[9] = -(local_40.Data[0x16] == 'n'),
         auVar11[10] = -(local_40.Data[0x17] == 'a'), auVar11[0xb] = -(local_40.Data[0x18] == 'l'),
         auVar11[0xc] = -(local_40.Data[0x19] == 'y'), auVar11[0xd] = -(local_40.Data[0x1a] == 's'),
         auVar11[0xe] = -(local_40.Data[0x1b] == 'i'), auVar11[0xf] = -(local_40.Data[0x1c] == 's'),
         auVar7[0] = -(*local_40.Data == 'r'), auVar7[1] = -(local_40.Data[1] == 'e'),
         auVar7[2] = -(local_40.Data[2] == 'p'), auVar7[3] = -(local_40.Data[3] == 'a'),
         auVar7[4] = -(local_40.Data[4] == 'i'), auVar7[5] = -(local_40.Data[5] == 'r'),
         auVar7[6] = -(local_40.Data[6] == '-'), auVar7[7] = -(local_40.Data[7] == 'v'),
         auVar7[8] = -(local_40.Data[8] == 'i'), auVar7[9] = -(local_40.Data[9] == 'a'),
         auVar7[10] = -(local_40.Data[10] == '-'), auVar7[0xb] = -(local_40.Data[0xb] == 'o'),
         auVar7[0xc] = -(local_40.Data[0xc] == 'w'), auVar7[0xd] = -(local_40.Data[0xd] == 'n'),
         auVar7[0xe] = -(local_40.Data[0xe] == 'e'), auVar7[0xf] = -(local_40.Data[0xf] == 'r'),
         auVar7 = auVar7 & auVar11,
         (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff)) {
        if (local_30.Length == 5) {
          if ((char)*(int *)((long)local_30.Data + 4) == 'e' && *(int *)local_30.Data == 0x736c6166)
          {
            (this->super_Command).repairViaOwnershipAnalysis = false;
            return true;
          }
        }
        else if ((local_30.Length == 4) && (*(int *)local_30.Data == 0x65757274)) {
          (this->super_Command).repairViaOwnershipAnalysis = true;
          return true;
        }
        llvm::Twine::Twine((Twine *)local_d8,"invalid value for attribute: \'",&local_40);
        llvm::Twine::Twine((Twine *)local_f8,"\'");
        llvm::operator+(&local_b8,(Twine *)local_d8,(Twine *)local_f8);
        goto LAB_001ac951;
      }
    }
LAB_001ac4e1:
    llvm::Twine::Twine((Twine *)local_d8,"unexpected attribute: \'",&local_40);
    llvm::Twine::Twine((Twine *)local_f8,"\'");
    if (((NodeKind)local_c8 == NullKind) || ((NodeKind)local_e8 == NullKind)) {
LAB_001ac8e2:
      local_b8._16_2_ = 0x100;
      goto LAB_001ac951;
    }
    if ((NodeKind)local_c8 == EmptyKind) {
      local_b8.LHSKind = (NodeKind)local_e8;
      local_b8.RHSKind = local_e8._1_1_;
      local_b8._18_6_ = uStack_e6;
      goto LAB_001ac951;
    }
    if ((NodeKind)local_e8 == EmptyKind) {
      local_b8.LHSKind = (NodeKind)local_c8;
      local_b8.RHSKind = local_c8._1_1_;
      local_b8._18_6_ = uStack_c6;
      goto LAB_001ac951;
    }
    NVar2 = (NodeKind)local_c8;
    if (local_c8._1_1_ != EmptyKind) {
      local_d8[0].twine = (Twine *)local_d8;
      NVar2 = TwineKind;
    }
    local_a0 = local_f8[0];
    local_90 = (NodeKind)local_e8;
    if (local_e8._1_1_ != EmptyKind) {
      local_a0.twine = (Twine *)local_f8;
      local_90 = TwineKind;
    }
  }
  llvm::Twine::Twine(&local_b8,local_d8[0],NVar2,local_a0,local_90);
LAB_001ac951:
  ConfigureContext::error(ctx,&local_b8);
  return false;
}

Assistant:

bool ExternalCommand::
configureAttribute(const ConfigureContext& ctx, StringRef name,
                   StringRef value) {
  if (name == "allow-missing-inputs") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    allowMissingInputs = value == "true";
    return true;
  } else if (name == "allow-modified-outputs") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    allowModifiedOutputs = value == "true";
    return true;
  } else if (name == "always-out-of-date") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    alwaysOutOfDate = value == "true";
    return true;
    
  } else if (name == "repair-via-ownership-analysis") {
    if (value == "true") {
      repairViaOwnershipAnalysis = true;
      return true;
    } else if (value == "false") {
      repairViaOwnershipAnalysis = false;
      return true;
    } else {
      ctx.error("invalid value for attribute: '" + name + "'");
      return false;
    }
  } else {
    ctx.error("unexpected attribute: '" + name + "'");
    return false;
  }
}